

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local.cpp
# Opt level: O3

HLOCAL LocalReAlloc(HLOCAL hMem,SIZE_T uBytes,UINT uFlags)

{
  HANDLE hHeap;
  LPVOID pvVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (uFlags == 2) {
      hHeap = GetProcessHeap();
      pvVar1 = HeapReAlloc(hHeap,0,hMem,uBytes);
    }
    else {
      pvVar1 = (LPVOID)0x0;
      fprintf(_stderr,"] %s %s:%d","LocalReAlloc",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/local.cpp"
              ,0x65);
      fprintf(_stderr,"Invalid parameter uFlags=0x%x\n",(ulong)uFlags);
      SetLastError(0x57);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return pvVar1;
    }
  }
  abort();
}

Assistant:

HLOCAL
PALAPI
LocalReAlloc(
       IN HLOCAL hMem,
       IN SIZE_T uBytes,
       IN UINT   uFlags)
{
    LPVOID lpRetVal = NULL;
    PERF_ENTRY(LocalReAlloc);
    ENTRY("LocalReAlloc (hMem=%p, uBytes=%u, uFlags=%#x)\n", hMem, uBytes, uFlags);

    if (uFlags != LMEM_MOVEABLE) {
        // Currently valid iff uFlags is LMEM_MOVEABLE
        ASSERT("Invalid parameter uFlags=0x%x\n", uFlags);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    uFlags = 0;

    lpRetVal = HeapReAlloc(GetProcessHeap(), uFlags, hMem, uBytes);

done:
    LOGEXIT("LocalReAlloc returning %p.\n", lpRetVal);
    PERF_EXIT(LocalReAlloc);
    return (HLOCAL)lpRetVal;
}